

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::GetStringDefaultValueInternal_abi_cxx11_
          (string *__return_storage_ptr__,FieldGeneratorBase *this,FieldDescriptor *descriptor)

{
  undefined1 uVar1;
  undefined1 uVar3;
  undefined2 uVar4;
  EnumValueDescriptor *pEVar2;
  undefined4 uVar5;
  char *in_RCX;
  string_view input;
  string local_128;
  AlphaNum local_108;
  AlphaNum local_d8;
  AlphaNum local_a8;
  AlphaNum local_78;
  AlphaNum local_48;
  
  if (((descriptor->field_20).default_value_enum_)->all_names_ == (string *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"\"\"",(allocator<char> *)&local_108);
  }
  else {
    local_108.piece_ =
         absl::lts_20250127::NullSafeStringView
                   (
                   "global::System.Text.Encoding.UTF8.GetString(global::System.Convert.FromBase64String(\""
                   );
    pEVar2 = (descriptor->field_20).default_value_enum_;
    uVar1 = pEVar2->super_SymbolBaseN<0>;
    uVar3 = pEVar2->super_SymbolBaseN<1>;
    uVar4 = *(undefined2 *)&pEVar2->field_0x2;
    uVar5 = pEVar2->number_;
    input._M_len._4_4_ = uVar5;
    input._M_len._2_2_ = uVar4;
    input._M_len._1_1_ = uVar3;
    input._M_len._0_1_ = uVar1;
    input._M_str = in_RCX;
    StringToBase64_abi_cxx11_(&local_128,(csharp *)pEVar2->all_names_,input);
    local_a8.piece_._M_len = local_128._M_string_length;
    local_a8.piece_._M_str = local_128._M_dataplus._M_p;
    local_d8.piece_ = absl::lts_20250127::NullSafeStringView("\"), 0, ");
    absl::lts_20250127::AlphaNum::AlphaNum
              (&local_78,((descriptor->field_20).default_value_string_)->_M_string_length);
    local_48.piece_ = absl::lts_20250127::NullSafeStringView(")");
    absl::lts_20250127::StrCat<>
              (__return_storage_ptr__,&local_108,&local_a8,&local_d8,&local_78,&local_48);
    std::__cxx11::string::~string((string *)&local_128);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FieldGeneratorBase::GetStringDefaultValueInternal(const FieldDescriptor* descriptor) {
    if (descriptor->default_value_string().empty())
        return "\"\"";
    return absl::StrCat(
        "global::System.Text.Encoding.UTF8.GetString(global::System."
        "Convert.FromBase64String(\"",
        StringToBase64(descriptor->default_value_string()), "\"), 0, ",
        descriptor->default_value_string().length(), ")");
}